

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbTest.c
# Opt level: O1

Gia_Man_t * Acb_NtkGiaDeriveDual(Acb_Ntk_t *p)

{
  int iVar1;
  ulong uVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *vCopies;
  int *piVar6;
  Gia_Man_t *p_00;
  char *__s;
  size_t sVar7;
  char *__dest;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *vTemp;
  int *piVar9;
  Vec_Int_t *__ptr;
  Gia_Man_t *pGVar10;
  int iVar11;
  long lVar12;
  
  iVar1 = (p->vObjType).nSize;
  lVar12 = (long)iVar1 * 2 + -2;
  vCopies = (Vec_Int_t *)malloc(0x10);
  iVar4 = (int)lVar12;
  iVar11 = 0x10;
  if (0xe < iVar4 - 1U) {
    iVar11 = iVar4;
  }
  vCopies->nSize = 0;
  vCopies->nCap = iVar11;
  if (iVar11 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar11 << 2);
  }
  vCopies->pArray = piVar6;
  vCopies->nSize = iVar4;
  if (piVar6 != (int *)0x0) {
    memset(piVar6,0xff,lVar12 * 4);
  }
  p_00 = Gia_ManStart((iVar1 + -1) * 5);
  __s = Abc_NamStr(p->pDesign->pStrs,p->NameId);
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar7 = strlen(__s);
    __dest = (char *)malloc(sVar7 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  Gia_ManHashAlloc(p_00);
  if (1 < iVar1) {
    piVar6[0] = 0;
    piVar6[1] = 0;
    if (0 < (p->vCis).nSize) {
      lVar12 = 0;
      do {
        iVar1 = (p->vCis).pArray[lVar12];
        if ((iVar1 < 0) || (uVar5 = iVar1 * 2, iVar4 <= (int)uVar5)) goto LAB_003ac52e;
        pGVar8 = Gia_ManAppendObj(p_00);
        uVar2 = *(ulong *)pGVar8;
        *(ulong *)pGVar8 = uVar2 | 0x9fffffff;
        *(ulong *)pGVar8 =
             uVar2 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar3 = p_00->pObjs;
        if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) {
LAB_003ac54d:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * -0x55555555);
        pGVar3 = p_00->pObjs;
        if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) goto LAB_003ac54d;
        piVar6[uVar5] = (int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * 0x55555556;
        piVar6[(ulong)uVar5 + 1] = 0;
        lVar12 = lVar12 + 1;
      } while (lVar12 < (p->vCis).nSize);
    }
    vTemp = (Vec_Int_t *)malloc(0x10);
    vTemp->nCap = 0x10;
    vTemp->nSize = 0;
    piVar9 = (int *)malloc(0x40);
    vTemp->pArray = piVar9;
    __ptr = Acb_NtkFindNodes2(p);
    if (0 < __ptr->nSize) {
      lVar12 = 0;
      do {
        iVar1 = __ptr->pArray[lVar12];
        if ((iVar1 < 0) || (iVar4 <= iVar1 * 2)) goto LAB_003ac52e;
        Acb_ObjToGiaDual(p_00,p,iVar1,vTemp,vCopies,piVar6 + (uint)(iVar1 * 2));
        lVar12 = lVar12 + 1;
      } while (lVar12 < __ptr->nSize);
    }
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (int *)0x0;
    }
    if (__ptr != (Vec_Int_t *)0x0) {
      free(__ptr);
    }
    if (vTemp->pArray != (int *)0x0) {
      free(vTemp->pArray);
      vTemp->pArray = (int *)0x0;
    }
    free(vTemp);
    if (0 < (p->vCos).nSize) {
      lVar12 = 0;
      do {
        iVar1 = (p->vCos).pArray[lVar12];
        if ((long)iVar1 < 1) {
          __assert_fail("i>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                        ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
        }
        if ((p->vObjFans).nSize <= iVar1) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = (p->vObjFans).pArray[iVar1];
        if (((((long)iVar1 < 0) || ((p->vFanSto).nSize <= iVar1)) ||
            (iVar1 = (p->vFanSto).pArray[(long)iVar1 + 1], iVar1 < 0)) ||
           (uVar5 = iVar1 * 2, vCopies->nSize <= (int)uVar5)) goto LAB_003ac52e;
        piVar6 = vCopies->pArray;
        Gia_ManAppendCo(p_00,piVar6[uVar5]);
        Gia_ManAppendCo(p_00,piVar6[(ulong)uVar5 + 1]);
        lVar12 = lVar12 + 1;
      } while (lVar12 < (p->vCos).nSize);
    }
    if (vCopies->pArray != (int *)0x0) {
      free(vCopies->pArray);
      vCopies->pArray = (int *)0x0;
    }
    free(vCopies);
    pGVar10 = Gia_ManCleanup(p_00);
    Gia_ManStop(p_00);
    return pGVar10;
  }
LAB_003ac52e:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
}

Assistant:

Gia_Man_t * Acb_NtkGiaDeriveDual( Acb_Ntk_t * p )
{
    extern Vec_Int_t * Acb_NtkFindNodes2( Acb_Ntk_t * p );
    Gia_Man_t * pNew, * pOne;
    Vec_Int_t * vFanins, * vNodes;
    Vec_Int_t * vCopies = Vec_IntStartFull( 2*Acb_NtkObjNum(p) );
    int i, iObj, * pLits;
    pNew = Gia_ManStart( 5 * Acb_NtkObjNum(p) );
    pNew->pName = Abc_UtilStrsav(Acb_NtkName(p));
    Gia_ManHashAlloc( pNew );
    pLits = Vec_IntEntryP( vCopies, 0 );
    pLits[0] = 0;
    pLits[1] = 0;
    Acb_NtkForEachCi( p, iObj, i )
    {
        pLits = Vec_IntEntryP( vCopies, 2*iObj );
        pLits[0] = Gia_ManAppendCi(pNew);
        pLits[1] = 0;
    }
    vFanins = Vec_IntAlloc( 4 );
    vNodes  = Acb_NtkFindNodes2( p );
    Vec_IntForEachEntry( vNodes, iObj, i )
    {
        pLits = Vec_IntEntryP( vCopies, 2*iObj );
        Acb_ObjToGiaDual( pNew, p, iObj, vFanins, vCopies, pLits );
    }
    Vec_IntFree( vNodes );
    Vec_IntFree( vFanins );
    Acb_NtkForEachCo( p, iObj, i )
    {
        pLits = Vec_IntEntryP( vCopies, 2*Acb_ObjFanin(p, iObj, 0) );
        Gia_ManAppendCo( pNew, pLits[0] );
        Gia_ManAppendCo( pNew, pLits[1] );
    }
    Vec_IntFree( vCopies );
    pNew = Gia_ManCleanup( pOne = pNew );
    Gia_ManStop( pOne );
    return pNew;
}